

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall
fmcalc::parse_policytc(fmcalc *this,vector<fm_policyTC,_std::allocator<fm_policyTC>_> *p)

{
  FILE *__stream;
  bool bVar1;
  long lVar2;
  char *__filename;
  FILE *__stream_00;
  undefined8 uVar3;
  pointer pfVar4;
  iterator __first;
  iterator __last;
  undefined1 local_150 [8];
  fm_policyTC f_1;
  _Self local_138;
  iterator iter_1;
  layer_agg l_1;
  int j;
  int i_1;
  value_type local_108;
  layer_agg l;
  int local_f4;
  iterator iStack_f0;
  int max_agg_id;
  iterator iter;
  set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> la;
  size_t i;
  int max_level_id;
  int max_layer_id;
  fm_policyTC f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [8];
  string file;
  FILE *fin;
  vector<fm_policyTC,_std::allocator<fm_policyTC>_> *p_local;
  fmcalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"input/fm_policytc.bin",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)&f.layer_id,(ulong)local_40);
    std::operator+(local_78,&this->inputpath_);
    std::__cxx11::string::operator=(local_40,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&f.layer_id);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(__filename,"rb");
  __stream = _stderr;
  if (__stream_00 != (FILE *)0x0) {
    i._4_4_ = 0;
    i._0_4_ = 0;
    la._M_t._M_impl.super__Rb_tree_header._M_node_count = fread(&max_level_id,0x10,1,__stream_00);
    while (la._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::push_back
                (p,(value_type *)&max_level_id);
      if ((int)i < max_level_id) {
        i._0_4_ = max_level_id;
      }
      la._M_t._M_impl.super__Rb_tree_header._M_node_count = fread(&max_level_id,0x10,1,__stream_00);
    }
    fclose(__stream_00);
    std::set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_>::set
              ((set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> *)&iter);
    iStack_f0 = std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::begin(p);
    local_f4 = 0;
    while( true ) {
      l = (layer_agg)std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::end(p);
      bVar1 = __gnu_cxx::operator!=
                        (&stack0xffffffffffffff10,
                         (__normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                          *)&l);
      if (!bVar1) break;
      pfVar4 = __gnu_cxx::
               __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
               ::operator->(&stack0xffffffffffffff10);
      if (pfVar4->level_id == (int)i) {
        pfVar4 = __gnu_cxx::
                 __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                 ::operator->(&stack0xffffffffffffff10);
        if (local_f4 < pfVar4->agg_id) {
          pfVar4 = __gnu_cxx::
                   __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                   ::operator->(&stack0xffffffffffffff10);
          local_f4 = pfVar4->agg_id;
        }
        pfVar4 = __gnu_cxx::
                 __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                 ::operator->(&stack0xffffffffffffff10);
        if (i._4_4_ < pfVar4->layer_id) {
          pfVar4 = __gnu_cxx::
                   __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                   ::operator->(&stack0xffffffffffffff10);
          i._4_4_ = pfVar4->layer_id;
        }
        pfVar4 = __gnu_cxx::
                 __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                 ::operator->(&stack0xffffffffffffff10);
        local_108.agg_id = pfVar4->agg_id;
        pfVar4 = __gnu_cxx::
                 __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                 ::operator->(&stack0xffffffffffffff10);
        local_108.layer_id = pfVar4->layer_id;
        std::set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_>::insert
                  ((set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> *)&iter,
                   &local_108);
      }
      __gnu_cxx::
      __normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>::
      operator++(&stack0xffffffffffffff10,0);
    }
    for (l_1.agg_id = 1; l_1.agg_id <= i._4_4_; l_1.agg_id = l_1.agg_id + 1) {
      for (l_1.layer_id = 1; l_1.layer_id <= local_f4; l_1.layer_id = l_1.layer_id + 1) {
        iter_1._M_node._0_4_ = l_1.agg_id;
        iter_1._M_node._4_4_ = l_1.layer_id;
        local_138._M_node =
             (_Base_ptr)
             std::set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_>::find
                       ((set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> *)&iter,
                        (key_type *)&iter_1);
        f_1._8_8_ = std::set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_>::end
                              ((set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> *)
                               &iter);
        bVar1 = std::operator==(&local_138,(_Self *)&f_1.layer_id);
        if (bVar1) {
          local_150._4_4_ = iter_1._M_node._4_4_;
          f_1.level_id = (int)iter_1._M_node;
          local_150._0_4_ = (int)i;
          f_1.agg_id = this->noop_profile_id;
          std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::push_back
                    (p,(value_type *)local_150);
        }
      }
    }
    __first = std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::begin(p);
    __last = std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>::end(p);
    std::
    sort<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>>
              ((__normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                )__first._M_current,
               (__normal_iterator<fm_policyTC_*,_std::vector<fm_policyTC,_std::allocator<fm_policyTC>_>_>
                )__last._M_current);
    std::set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_>::~set
              ((set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> *)&iter);
    std::__cxx11::string::~string(local_40);
    return;
  }
  uVar3 = std::__cxx11::string::c_str();
  fprintf(__stream,"FATAL: %s: cannot open %s\n","parse_policytc",uVar3);
  exit(1);
}

Assistant:

void fmcalc::parse_policytc(std::vector< fm_policyTC> &p)
{
	FILE* fin = NULL;
	std::string file = FMPOLICYTC_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");

	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_policyTC f;
	
	int max_layer_id = 0;
	int max_level_id = 0;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		p.push_back(f);		
		if (f.level_id > max_level_id) max_level_id = f.level_id;			
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);
	std::set<layer_agg> la;
	auto iter = p.begin();
	int max_agg_id = 0;

	while (iter != p.end()) {
		if (iter->level_id == max_level_id) {
			if (iter->agg_id > max_agg_id) max_agg_id = iter->agg_id;
			if (iter->layer_id > max_layer_id) max_layer_id = iter->layer_id;
			layer_agg l;
			l.agg_id = iter->agg_id;
			l.layer_id = iter->layer_id;
			la.insert(l);
		}
		iter++;
	}


	for (int i = 1;i <= max_layer_id;i++) {
		for (int j = 1;j <= max_agg_id;j++) {
			layer_agg l;
			l.layer_id = i;
			l.agg_id = j;
			auto iter = la.find(l);
			if (iter == la.end()) {
				fm_policyTC f;
				f.agg_id = l.agg_id;
				f.layer_id = l.layer_id;
				f.level_id = max_level_id;
				f.profile_id = noop_profile_id;
				p.push_back(f);
			}
		}
	}


	std::sort(p.begin(), p.end());

}